

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderSharedVarTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::SharedBasicVarCase::init(SharedBasicVarCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint y;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  uint *puVar5;
  ShaderProgram *pSVar6;
  RenderContext *renderCtx;
  ProgramSources *sources;
  TestLog *log;
  TestError *this_00;
  char *local_308;
  allocator<char> local_2f1;
  string local_2f0;
  undefined1 local_2c9;
  string local_2c8;
  ShaderSource local_2a8;
  ProgramSources local_280;
  ostringstream local_1a0 [8];
  ostringstream src;
  char *typeName;
  char *precName;
  int valArrayLength;
  SharedBasicVarCase *this_local;
  
  y = product<unsigned_int,3>(&this->m_workGroupSize);
  iVar2 = de::min<int>(0xf,y);
  if (this->m_precision == PRECISION_LAST) {
    local_308 = "";
  }
  else {
    local_308 = glu::getPrecisionName(this->m_precision);
  }
  pcVar3 = glu::getDataTypeName(this->m_basicType);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar4 = std::operator<<((ostream *)local_1a0,"#version 310 es\n");
  poVar4 = std::operator<<(poVar4,"layout (local_size_x = ");
  puVar5 = tcu::Vector<unsigned_int,_3>::operator[](&this->m_workGroupSize,0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*puVar5);
  poVar4 = std::operator<<(poVar4,", local_size_y = ");
  puVar5 = tcu::Vector<unsigned_int,_3>::operator[](&this->m_workGroupSize,1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*puVar5);
  poVar4 = std::operator<<(poVar4,", local_size_z = ");
  puVar5 = tcu::Vector<unsigned_int,_3>::operator[](&this->m_workGroupSize,2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*puVar5);
  poVar4 = std::operator<<(poVar4,") in;\n");
  poVar4 = std::operator<<(poVar4,
                           "const uint LOCAL_SIZE = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar4 = std::operator<<(poVar4,"shared ");
  poVar4 = std::operator<<(poVar4,local_308);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4," s_var;\n");
  poVar4 = std::operator<<(poVar4,"uniform ");
  poVar4 = std::operator<<(poVar4,local_308);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4," u_val[");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,"];\n");
  poVar4 = std::operator<<(poVar4,"uniform ");
  poVar4 = std::operator<<(poVar4,local_308);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  poVar4 = std::operator<<(poVar4," u_ref[");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  poVar4 = std::operator<<(poVar4,"];\n");
  poVar4 = std::operator<<(poVar4,"uniform uint u_numIters;\n");
  poVar4 = std::operator<<(poVar4,"layout(binding = 0) buffer Result\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"\tbool isOk[LOCAL_SIZE];\n");
  poVar4 = std::operator<<(poVar4,"};\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"void main (void)\n");
  poVar4 = std::operator<<(poVar4,"{\n");
  poVar4 = std::operator<<(poVar4,"\tbool allOk = true;\n");
  poVar4 = std::operator<<(poVar4,"\tfor (uint ndx = 0u; ndx < u_numIters; ndx++)\n");
  poVar4 = std::operator<<(poVar4,"\t{\n");
  poVar4 = std::operator<<(poVar4,"\t\tif (ndx == gl_LocalInvocationIndex)\n");
  poVar4 = std::operator<<(poVar4,"\t\t\ts_var = u_val[ndx%uint(u_val.length())];\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"\t\tbarrier();\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"\t\tif (s_var != u_ref[ndx%uint(u_ref.length())])\n");
  poVar4 = std::operator<<(poVar4,"\t\t\tallOk = false;\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"\t\tbarrier();\n");
  poVar4 = std::operator<<(poVar4,"\t}\n");
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"\tisOk[gl_LocalInvocationIndex] = allOk;\n");
  std::operator<<(poVar4,"}\n");
  pSVar6 = (ShaderProgram *)operator_new(0xd0);
  local_2c9 = 1;
  renderCtx = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_280);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_2a8,&local_2c8);
  sources = glu::ProgramSources::operator<<(&local_280,&local_2a8);
  glu::ShaderProgram::ShaderProgram(pSVar6,renderCtx,sources);
  local_2c9 = 0;
  this->m_program = pSVar6;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  glu::ProgramSources::~ProgramSources(&local_280);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::operator<<(log,this->m_program);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar1) {
    pSVar6 = this->m_program;
    if (pSVar6 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar6);
      operator_delete(pSVar6,0xd0);
    }
    this->m_program = (ShaderProgram *)0x0;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"Compile failed",&local_2f1);
    tcu::TestError::TestError(this_00,&local_2f0);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  iVar2 = std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return iVar2;
}

Assistant:

void SharedBasicVarCase::init (void)
{
	const int			valArrayLength	= de::min<int>(MAX_VALUE_ARRAY_LENGTH, product(m_workGroupSize));
	const char*			precName		= m_precision != glu::PRECISION_LAST ? getPrecisionName(m_precision) : "";
	const char*			typeName		= getDataTypeName(m_basicType);
	std::ostringstream	src;

	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_workGroupSize[0]
		<< ", local_size_y = " << m_workGroupSize[1]
		<< ", local_size_z = " << m_workGroupSize[2]
		<< ") in;\n"
		<< "const uint LOCAL_SIZE = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "shared " << precName << " " << typeName << " s_var;\n"
		<< "uniform " << precName << " " << typeName << " u_val[" << valArrayLength << "];\n"
		<< "uniform " << precName << " " << typeName << " u_ref[" << valArrayLength << "];\n"
		<< "uniform uint u_numIters;\n"
		<< "layout(binding = 0) buffer Result\n"
		<< "{\n"
		<< "	bool isOk[LOCAL_SIZE];\n"
		<< "};\n"
		<< "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	bool allOk = true;\n"
		<< "	for (uint ndx = 0u; ndx < u_numIters; ndx++)\n"
		<< "	{\n"
		<< "		if (ndx == gl_LocalInvocationIndex)\n"
		<< "			s_var = u_val[ndx%uint(u_val.length())];\n"
		<< "\n"
		<< "		barrier();\n"
		<< "\n"
		<< "		if (s_var != u_ref[ndx%uint(u_ref.length())])\n"
		<< "			allOk = false;\n"
		<< "\n"
		<< "		barrier();\n"
		<< "	}\n"
		<< "\n"
		<< "	isOk[gl_LocalInvocationIndex] = allOk;\n"
		<< "}\n";

	DE_ASSERT(!m_program);
	m_program = new ShaderProgram(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}
}